

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGGeometryElement::updateMarkerPositions
          (SVGGeometryElement *this,SVGMarkerPositionList *positions,SVGLayoutState *state)

{
  bool bVar1;
  PathCommand PVar2;
  OrientType OVar3;
  string *psVar4;
  reference pvVar5;
  SVGAngle *this_00;
  int __x;
  Point *a;
  float extraout_XMM0_Da;
  double dVar6;
  Point PVar7;
  Point PVar8;
  undefined1 auVar9 [16];
  Point *local_138;
  Point *local_120;
  float local_110;
  Point PStack_10c;
  float angle_2;
  Point slope_1;
  float angle_1;
  float outangle;
  float inangle;
  Point outslope;
  Point inslope;
  SVGAngle *orient;
  Point PStack_d8;
  float angle;
  Point slope;
  undefined1 local_c8 [8];
  PathIterator it;
  array<lunasvg::Point,_3UL> points;
  int index;
  Point outslopePoints [2];
  Point inslopePoints [2];
  Point startPoint;
  Point origin;
  SVGMarkerElement *local_58;
  SVGMarkerElement *markerEnd;
  char *local_48;
  SVGMarkerElement *local_40;
  SVGMarkerElement *markerMid;
  char *local_30;
  SVGMarkerElement *local_28;
  SVGMarkerElement *markerStart;
  SVGLayoutState *state_local;
  SVGMarkerPositionList *positions_local;
  SVGGeometryElement *this_local;
  
  markerStart = (SVGMarkerElement *)state;
  state_local = (SVGLayoutState *)positions;
  positions_local = (SVGMarkerPositionList *)this;
  bVar1 = Path::isEmpty(&this->m_path);
  if (!bVar1) {
    psVar4 = SVGLayoutState::marker_start_abi_cxx11_((SVGLayoutState *)markerStart);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    local_30 = auVar9._8_8_;
    markerMid = auVar9._0_8_;
    local_28 = SVGElement::getMarker((SVGElement *)this,(string_view *)&markerMid);
    psVar4 = SVGLayoutState::marker_mid_abi_cxx11_((SVGLayoutState *)markerStart);
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    local_48 = auVar9._8_8_;
    markerEnd = auVar9._0_8_;
    local_40 = SVGElement::getMarker((SVGElement *)this,(string_view *)&markerEnd);
    psVar4 = SVGLayoutState::marker_end_abi_cxx11_((SVGLayoutState *)markerStart);
    origin = (Point)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
    local_58 = SVGElement::getMarker((SVGElement *)this,(string_view *)&origin);
    if (((local_28 != (SVGMarkerElement *)0x0) || (local_40 != (SVGMarkerElement *)0x0)) ||
       (local_58 != (SVGMarkerElement *)0x0)) {
      Point::Point(&startPoint);
      Point::Point(inslopePoints + 1);
      local_120 = outslopePoints + 1;
      do {
        Point::Point(local_120);
        local_120 = local_120 + 1;
      } while (local_120 != inslopePoints + 1);
      local_138 = (Point *)&points._M_elems[2].y;
      do {
        Point::Point(local_138);
        local_138 = local_138 + 1;
      } while (local_138 != outslopePoints + 1);
      points._M_elems[2].x = 0.0;
      std::array<lunasvg::Point,_3UL>::array((array<lunasvg::Point,_3UL> *)&it.m_index);
      PathIterator::PathIterator((PathIterator *)local_c8,&this->m_path);
      while (bVar1 = PathIterator::isDone((PathIterator *)local_c8), ((bVar1 ^ 0xffU) & 1) != 0) {
        PVar2 = PathIterator::currentSegment
                          ((PathIterator *)local_c8,(array<lunasvg::Point,_3UL> *)&it.m_index);
        switch(PVar2) {
        case MoveTo:
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,0);
          inslopePoints[1] = *pvVar5;
          outslopePoints[1] = startPoint;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,0);
          inslopePoints[0] = *pvVar5;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,0);
          startPoint = *pvVar5;
          break;
        case LineTo:
          outslopePoints[1] = startPoint;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,0);
          inslopePoints[0] = *pvVar5;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,0);
          startPoint = *pvVar5;
          break;
        case CubicTo:
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,1);
          outslopePoints[1] = *pvVar5;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,2);
          inslopePoints[0] = *pvVar5;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,2);
          startPoint = *pvVar5;
          break;
        case Close:
          outslopePoints[1] = startPoint;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,0);
          inslopePoints[0] = *pvVar5;
          startPoint = inslopePoints[1];
          memset(&slope,0,8);
          Point::Point(&slope);
          inslopePoints[1] = slope;
        }
        PathIterator::next((PathIterator *)local_c8);
        bVar1 = PathIterator::isDone((PathIterator *)local_c8);
        if ((!bVar1) &&
           ((local_28 != (SVGMarkerElement *)0x0 || (local_40 != (SVGMarkerElement *)0x0)))) {
          PathIterator::currentSegment
                    ((PathIterator *)local_c8,(array<lunasvg::Point,_3UL> *)&it.m_index);
          stack0xffffffffffffff68 = startPoint;
          pvVar5 = std::array<lunasvg::Point,_3UL>::operator[]
                             ((array<lunasvg::Point,_3UL> *)&it.m_index,0);
          outslopePoints[0] = *pvVar5;
          if ((points._M_elems[2].x == 0.0) && (local_28 != (SVGMarkerElement *)0x0)) {
            PStack_d8 = lunasvg::operator-(outslopePoints,(Point *)&points._M_elems[2].y);
            dVar6 = std::atan2((double)((ulong)PStack_d8 >> 0x20),
                               (double)((ulong)PStack_d8 & 0xffffffff));
            orient._4_4_ = (SUB84(dVar6,0) * 180.0) / 3.1415927;
            this_00 = SVGMarkerElement::orient(local_28);
            OVar3 = SVGAngle::orientType(this_00);
            if (OVar3 == AutoStartReverse) {
              orient._4_4_ = orient._4_4_ - 180.0;
            }
            std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
            emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                      ((vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>
                        *)state_local,&local_28,&startPoint,(float *)((long)&orient + 4));
          }
          if ((0 < (int)points._M_elems[2].x) && (local_40 != (SVGMarkerElement *)0x0)) {
            PVar7 = lunasvg::operator-(inslopePoints,outslopePoints + 1);
            a = outslopePoints;
            PVar8 = lunasvg::operator-(a,(Point *)&points._M_elems[2].y);
            __x = (int)a;
            dVar6 = std::atan2((double)((ulong)PVar7 >> 0x20),(double)((ulong)PVar7 & 0xffffffff));
            angle_1 = (SUB84(dVar6,0) * 180.0) / 3.1415927;
            dVar6 = std::atan2((double)((ulong)PVar8 >> 0x20),(double)((ulong)PVar8 & 0xffffffff));
            slope_1.y = (SUB84(dVar6,0) * 180.0) / 3.1415927;
            std::abs(__x);
            if (180.0 < extraout_XMM0_Da) {
              angle_1 = angle_1 + 360.0;
            }
            slope_1.x = (angle_1 + slope_1.y) * 0.5;
            std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
            emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                      ((vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>
                        *)state_local,&local_40,&startPoint,&slope_1.x);
          }
        }
        if ((local_58 != (SVGMarkerElement *)0x0) &&
           (bVar1 = PathIterator::isDone((PathIterator *)local_c8), bVar1)) {
          PStack_10c = lunasvg::operator-(inslopePoints,outslopePoints + 1);
          dVar6 = std::atan2((double)((ulong)PStack_10c >> 0x20),
                             (double)((ulong)PStack_10c & 0xffffffff));
          local_110 = (SUB84(dVar6,0) * 180.0) / 3.1415927;
          std::vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>::
          emplace_back<lunasvg::SVGMarkerElement*&,lunasvg::Point&,float&>
                    ((vector<lunasvg::SVGMarkerPosition,std::allocator<lunasvg::SVGMarkerPosition>>
                      *)state_local,&local_58,&startPoint,&local_110);
        }
        points._M_elems[2].x = (float)((int)points._M_elems[2].x + 1);
      }
    }
  }
  return;
}

Assistant:

void SVGGeometryElement::updateMarkerPositions(SVGMarkerPositionList& positions, const SVGLayoutState& state)
{
    if(m_path.isEmpty())
        return;
    auto markerStart = getMarker(state.marker_start());
    auto markerMid = getMarker(state.marker_mid());
    auto markerEnd = getMarker(state.marker_end());
    if(markerStart == nullptr && markerMid == nullptr && markerEnd == nullptr) {
        return;
    }

    Point origin;
    Point startPoint;
    Point inslopePoints[2];
    Point outslopePoints[2];

    int index = 0;
    std::array<Point, 3> points;
    PathIterator it(m_path);
    while(!it.isDone()) {
        switch(it.currentSegment(points)) {
        case PathCommand::MoveTo:
            startPoint = points[0];
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::LineTo:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = points[0];
            break;
        case PathCommand::CubicTo:
            inslopePoints[0] = points[1];
            inslopePoints[1] = points[2];
            origin = points[2];
            break;
        case PathCommand::Close:
            inslopePoints[0] = origin;
            inslopePoints[1] = points[0];
            origin = startPoint;
            startPoint = Point();
            break;
        }

        it.next();

        if(!it.isDone() && (markerStart || markerMid)) {
            it.currentSegment(points);
            outslopePoints[0] = origin;
            outslopePoints[1] = points[0];
            if(index == 0 && markerStart) {
                auto slope = outslopePoints[1] - outslopePoints[0];
                auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
                const auto& orient = markerStart->orient();
                if(orient.orientType() == SVGAngle::OrientType::AutoStartReverse)
                    angle -= 180.f;
                positions.emplace_back(markerStart, origin, angle);
            }

            if(index > 0 && markerMid) {
                auto inslope = inslopePoints[1] - inslopePoints[0];
                auto outslope = outslopePoints[1] - outslopePoints[0];
                auto inangle = 180.f * std::atan2(inslope.y, inslope.x) / PLUTOVG_PI;
                auto outangle = 180.f * std::atan2(outslope.y, outslope.x) / PLUTOVG_PI;
                if(std::abs(inangle - outangle) > 180.f)
                    inangle += 360.f;
                auto angle = (inangle + outangle) * 0.5f;
                positions.emplace_back(markerMid, origin, angle);
            }
        }

        if(markerEnd && it.isDone()) {
            auto slope = inslopePoints[1] - inslopePoints[0];
            auto angle = 180.f * std::atan2(slope.y, slope.x) / PLUTOVG_PI;
            positions.emplace_back(markerEnd, origin, angle);
        }

        index += 1;
    }
}